

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O2

void __thiscall BMRS<RemSP>::FirstScan(BMRS<RemSP> *this)

{
  int iVar1;
  uint data_width;
  uint uVar2;
  uint64_t *puVar3;
  uint64_t *bits_start;
  int j;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int j_1;
  long lVar7;
  int j_2;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint64_t *puVar12;
  ulong uVar13;
  uint64_t *puVar14;
  uint64_t *puVar15;
  uint64_t *puVar16;
  
  puVar3 = (this->data_compressed).bits;
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  data_width = (this->data_compressed).data_width;
  lVar10 = (long)(int)data_width;
  bits_start = (this->data_merged).bits;
  uVar8 = 0;
  uVar11 = 0;
  if (0 < (int)data_width) {
    uVar11 = (ulong)data_width;
  }
  iVar4 = (int)((long)iVar1 / 2);
  uVar13 = 0;
  if (0 < iVar4) {
    uVar13 = (long)iVar1 / 2 & 0xffffffff;
  }
  lVar7 = (long)(this->data_merged).data_width;
  puVar16 = puVar3 + lVar10;
  puVar14 = puVar3;
  puVar15 = bits_start;
  for (; uVar8 != uVar13; uVar8 = uVar8 + 1) {
    for (uVar5 = 0; uVar11 != uVar5; uVar5 = uVar5 + 1) {
      puVar15[uVar5] = puVar16[uVar5] | puVar14[uVar5];
    }
    puVar15 = puVar15 + lVar7;
    puVar16 = puVar16 + lVar10 * 2;
    puVar14 = puVar14 + lVar10 * 2;
  }
  if (iVar1 % 2 != 0) {
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      bits_start[lVar7 * iVar4 + uVar8] = puVar3[(iVar1 + -1) * lVar10 + uVar8];
    }
  }
  uVar2 = (this->data_flags).height;
  puVar3 = (this->data_compressed).bits;
  puVar16 = (this->data_flags).bits;
  lVar7 = (long)(this->data_compressed).data_width;
  uVar11 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar11;
  }
  lVar6 = (long)(this->data_flags).data_width;
  puVar14 = puVar3 + lVar7;
  puVar12 = puVar16;
  puVar15 = puVar3;
  for (; puVar15 = puVar15 + lVar7 * 2, uVar11 != uVar8; uVar11 = uVar11 + 1) {
    puVar16[uVar11 * lVar6] =
         (puVar3[(uVar11 * 2 + 2) * lVar7] * 2 | puVar3[(uVar11 * 2 + 2) * lVar7]) &
         (puVar3[(uVar11 * 2 + 1) * lVar7] * 2 | puVar3[(uVar11 * 2 + 1) * lVar7]);
    for (lVar9 = 1; lVar9 < lVar10; lVar9 = lVar9 + 1) {
      puVar12[lVar9] =
           (puVar15[lVar9 + -1] >> 0x3f | puVar15[lVar9] << 1 | puVar15[lVar9]) &
           (puVar14[lVar9 + -1] >> 0x3f | puVar14[lVar9] << 1 | puVar14[lVar9]);
    }
    puVar14 = puVar14 + lVar7 * 2;
    puVar12 = puVar12 + lVar6;
  }
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  FindRuns(this,bits_start,(this->data_flags).bits,iVar4 + iVar1 % 2,data_width,
           (this->data_runs).runs);
  return;
}

Assistant:

void FirstScan() {
        int w(img_.cols);
        int h(img_.rows);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);
    }